

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall
cmCTest::SetCTestConfigurationFromCMakeVariable
          (cmCTest *this,cmMakefile *mf,char *dconfig,string *cmake_var,bool suppress)

{
  cmValue value;
  ostream *poVar1;
  char *local_1c8 [4];
  ostringstream cmCTestLog_msg;
  
  value = cmMakefile::GetDefinition(mf,cmake_var);
  if (value.Value != (string *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar1 = std::operator<<((ostream *)&cmCTestLog_msg,"SetCTestConfigurationFromCMakeVariable:");
    poVar1 = std::operator<<(poVar1,dconfig);
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = std::operator<<(poVar1,(string *)cmake_var);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0xd68,local_1c8[0],suppress);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    SetCTestConfiguration(this,dconfig,value.Value,suppress);
  }
  return value.Value != (string *)0x0;
}

Assistant:

bool cmCTest::SetCTestConfigurationFromCMakeVariable(
  cmMakefile* mf, const char* dconfig, const std::string& cmake_var,
  bool suppress)
{
  cmValue ctvar = mf->GetDefinition(cmake_var);
  if (!ctvar) {
    return false;
  }
  cmCTestOptionalLog(this, HANDLER_VERBOSE_OUTPUT,
                     "SetCTestConfigurationFromCMakeVariable:"
                       << dconfig << ":" << cmake_var << std::endl,
                     suppress);
  this->SetCTestConfiguration(dconfig, *ctvar, suppress);
  return true;
}